

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprSetHeight(Expr *p)

{
  int iVar1;
  int nHeight;
  int local_c;
  
  local_c = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_c = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_c < iVar1)) {
    local_c = iVar1;
  }
  if ((p->flags & 0x800) == 0) {
    heightOfExprList((p->x).pList,&local_c);
  }
  else {
    heightOfSelect((Select *)(p->x).pList,&local_c);
  }
  p->nHeight = local_c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else{
    heightOfExprList(p->x.pList, &nHeight);
  }
  p->nHeight = nHeight + 1;
}